

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
::remove_value(btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
               *this,int i,allocator_type *alloc)

{
  bool bVar1;
  byte bVar2;
  field_type fVar3;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
  *pbVar4;
  slot_type *first;
  slot_type *last;
  slot_type *result;
  long local_28;
  size_type j;
  allocator_type *alloc_local;
  int i_local;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
  *this_local;
  
  bVar1 = leaf(this);
  if (!bVar1) {
    bVar2 = count(this);
    if (i + 1 < (int)(uint)bVar2) {
      pbVar4 = child(this,i + 1);
      fVar3 = count(pbVar4);
      if (fVar3 != '\0') {
        __assert_fail("child(i + 1)->count() == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                      ,0x5ec,
                      "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>, 256, false>>::remove_value(const int, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>, 256, false>]"
                     );
      }
      local_28 = (long)(i + 1);
      while( true ) {
        bVar2 = count(this);
        if ((long)(ulong)bVar2 <= local_28) break;
        pbVar4 = child(this,(int)local_28 + 1);
        set_child(this,(int)local_28,pbVar4);
        local_28 = local_28 + 1;
      }
      bVar2 = count(this);
      clear_child(this,(uint)bVar2);
    }
  }
  first = slot(this,i + 1);
  bVar2 = count(this);
  last = slot(this,(uint)bVar2);
  result = slot(this,i);
  set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>
  ::slot_type::move(alloc,first,last,result);
  bVar2 = count(this);
  value_destroy(this,(long)(int)(bVar2 - 1),alloc);
  fVar3 = count(this);
  set_count(this,fVar3 + 0xff);
  return;
}

Assistant:

inline void btree_node<P>::remove_value(const int i, allocator_type *alloc) {
  if (!leaf() && count() > i + 1) {
    assert(child(i + 1)->count() == 0);
    for (size_type j = i + 1; j < count(); ++j) {
      set_child(j, child(j + 1));
    }
    clear_child(count());
  }

  slot_type::move(alloc, slot(i + 1), slot(count()), slot(i));
  value_destroy(count() - 1, alloc);
  set_count(count() - 1);
}